

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamIGA.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementBeamIGA::ComputeKRMmatricesGlobal
          (ChElementBeamIGA *this,ChMatrixRef *H,double Kfactor,double Rfactor,double Mfactor)

{
  plainobjectbase_evaluator_data<double,_3> *ppVar1;
  evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *peVar2;
  double *pdVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  element_type *peVar15;
  element_type *peVar16;
  element_type *peVar17;
  element_type *peVar18;
  PointerType pdVar19;
  pointer psVar20;
  pointer psVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined8 uVar24;
  double dVar25;
  plainobjectbase_evaluator_data<double,_3> pVar26;
  plainobjectbase_evaluator_data<double,_3> pVar27;
  plainobjectbase_evaluator_data<double,_3> pVar28;
  plainobjectbase_evaluator_data<double,_3> pVar29;
  plainobjectbase_evaluator_data<double,_3> pVar30;
  plainobjectbase_evaluator_data<double,_3> pVar31;
  plainobjectbase_evaluator_data<double,_3> pVar32;
  ChElementBeamIGA *pCVar33;
  undefined1 auVar34 [8];
  Index IVar35;
  int iVar36;
  SrcEvaluatorType srcEvaluator;
  undefined4 extraout_var;
  ChQuadratureTables *pCVar37;
  undefined8 *puVar38;
  Index size;
  double *pdVar39;
  PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *pPVar40;
  long lVar41;
  char *pcVar42;
  Index index;
  ulong uVar43;
  ChBeamSectionCosserat *pCVar44;
  long lVar45;
  undefined1 *puVar46;
  Index dstRows;
  ulong uVar47;
  element_type *peVar48;
  ActualDstType actualDst_1;
  long lVar49;
  long lVar50;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
  *kernel;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var51;
  double dVar52;
  ChElementBeamIGA *this_00;
  ChBeamSectionCosserat *pCVar53;
  char cVar54;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *unaff_R15;
  bool bVar55;
  byte bVar56;
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 in_register_00001288 [56];
  undefined1 auVar65 [64];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  ChMatrixDynamic<> K;
  ActualDstType actualDst;
  ChVectorDynamic<> Q1;
  ChState state_x_inc;
  ChVectorDynamic<> Jcolumn;
  ChVectorDynamic<> Q0;
  ChStateDelta state_delta;
  SrcEvaluatorType srcEvaluator_2;
  ChStateDelta state_w;
  DstEvaluatorType dstEvaluator;
  ChState state_x;
  SrcEvaluatorType srcEvaluator_1;
  ChMatrixNM<double,_6,_6> matr_loc;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_500;
  ChElementBeamIGA *local_4e0;
  ChBeamSectionCosserat *local_4d8;
  element_type *local_4d0;
  undefined1 local_4c1 [17];
  undefined1 local_4b0 [8];
  ChBeamSectionCosserat *pCStack_4a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_498;
  DenseStorage<double,__1,__1,__1,_1> local_490;
  double *local_470;
  ChBeamSectionCosserat *pCStack_468;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_460;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_458;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_450;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_440;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_438;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_430;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_428;
  double local_418;
  undefined1 local_410 [24];
  ChBeamSectionCosserat local_3f8;
  double local_3a0;
  double dStack_398;
  double dStack_390;
  double dStack_388;
  double local_380;
  ChStateDelta local_378;
  undefined1 local_360 [80];
  double adStack_310 [2];
  undefined1 local_300 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_2e0;
  element_type *peStack_2d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_2d0;
  element_type *peStack_2c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2c0;
  element_type *peStack_2b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_2b0;
  double dStack_2a8;
  double dStack_2a0;
  double dStack_298;
  double dStack_290;
  double dStack_288;
  double local_280;
  double dStack_278;
  double dStack_270;
  double dStack_268;
  double dStack_260;
  double dStack_258;
  double dStack_250;
  double dStack_248;
  double local_240;
  double dStack_238;
  double dStack_230;
  double dStack_228;
  double dStack_220;
  double dStack_218;
  double dStack_210;
  double dStack_208;
  double dStack_200;
  double dStack_1f8;
  double dStack_1f0;
  double dStack_1e8;
  ChVectorDynamic<> *local_1c0;
  double local_1b8;
  double local_1b0 [2];
  ChBeamSectionCosserat local_1a0;
  double dStack_148;
  double local_140;
  double dStack_138;
  double dStack_130;
  double dStack_128;
  double local_120;
  double dStack_118;
  double dStack_110;
  double dStack_108;
  double local_100;
  double dStack_f8;
  double dStack_f0;
  double dStack_e8;
  double local_e0;
  double dStack_d8;
  double dStack_d0;
  double dStack_c8;
  double local_c0;
  double dStack_b8;
  double dStack_b0;
  double dStack_a8;
  double local_a0;
  double dStack_98;
  double dStack_90;
  double dStack_88;
  
  auVar65._8_56_ = in_register_00001288;
  auVar65._0_8_ = Mfactor;
  lVar49 = ((long)(this->nodes).
                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->nodes).
                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * 3;
  local_498 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)Kfactor;
  local_460 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)Rfactor;
  local_418 = Mfactor;
  if (((H->
       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
       ).
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
       .
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
       .m_rows.m_value != lVar49) ||
     ((H->
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      ).
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value != lVar49)) {
    __assert_fail("(H.rows() == 6 * nodes.size()) && (H.cols() == 6 * nodes.size())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementBeamIGA.cpp"
                  ,0xd3,
                  "virtual void chrono::fea::ChElementBeamIGA::ComputeKRMmatricesGlobal(ChMatrixRef, double, double, double)"
                 );
  }
  if ((this->section).
      super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    __assert_fail("section",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementBeamIGA.cpp"
                  ,0xd4,
                  "virtual void chrono::fea::ChElementBeamIGA::ComputeKRMmatricesGlobal(ChMatrixRef, double, double, double)"
                 );
  }
  iVar36 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
             _vptr_ChElementBase[0x1e])(this);
  ChState::ChState((ChState *)(local_360 + 0x48),(long)iVar36,(ChIntegrable *)0x0);
  iVar36 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
             _vptr_ChElementBase[0x1f])(this);
  ChStateDelta::ChStateDelta(&local_378,(long)iVar36,(ChIntegrable *)0x0);
  (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase[0x20]
  )(this,0,local_360 + 0x48);
  (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase[0x21]
  )(this,0,&local_378);
  iVar36 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
             _vptr_ChElementBase[0x1f])(this);
  local_440 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(extraout_var,iVar36);
  local_4e0 = this;
  iVar36 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
             _vptr_ChElementBase[0x1e])(this);
  local_450.m_storage.m_data = (double *)0x0;
  local_450.m_storage.m_rows = 0;
  pCVar53 = (ChBeamSectionCosserat *)(long)(int)local_440;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_450,(Index)pCVar53)
  ;
  ComputeInternalForces_impl
            (local_4e0,(ChVectorDynamic<> *)&local_450,(ChState *)(local_360 + 0x48),&local_378,true
            );
  local_4b0 = (undefined1  [8])0x0;
  pCStack_4a8 = (ChBeamSectionCosserat *)0x0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_4b0,(Index)pCVar53);
  local_470 = (double *)0x0;
  pCStack_468 = (ChBeamSectionCosserat *)0x0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_470,(Index)pCVar53);
  local_4d8 = pCVar53;
  local_4d0 = (element_type *)H;
  if (((double)local_498 != 0.0) || (NAN((double)local_498))) {
    local_500.m_dst = (DstEvaluatorType *)0x0;
    local_500.m_src = (SrcEvaluatorType *)0x0;
    local_500.m_functor = (assign_op<double,_double> *)0x0;
    if ((int)local_440 < 0) goto LAB_0069ea74;
    if (((int)local_440 != 0) &&
       (auVar63._8_8_ = 0, auVar63._0_8_ = pCVar53,
       SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / auVar63,0) < (long)pCVar53)) {
      puVar38 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar38 = std::ostream::_M_insert<bool>;
      __cxa_throw(puVar38,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
              ((DenseStorage<double,__1,__1,__1,_1> *)&local_500,(long)pCVar53 * (long)pCVar53,
               (Index)pCVar53,(Index)pCVar53);
    ChState::ChState((ChState *)&local_490,(long)iVar36,(ChIntegrable *)0x0);
    ChStateDelta::ChStateDelta((ChStateDelta *)local_410,(Index)pCVar53,(ChIntegrable *)0x0);
    ChStateDelta::setZero((ChStateDelta *)local_410,(Index)pCVar53,(ChIntegrable *)0x0);
    auVar63 = auVar65._0_16_;
    if ((int)local_440 != 0) {
      local_3a0 = 4.94065645841247e-324;
      if (1 < (int)local_440) {
        local_3a0 = (double)((ulong)local_440 & 0xffffffff);
      }
      unaff_R15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      dVar52 = 0.0;
      do {
        if ((long)local_410._8_8_ <= (long)dVar52) goto LAB_0069e8fe;
        *(_func_int **)(local_410._0_8_ + dVar52 * 8) =
             (_func_int *)(Delta + (double)*(_func_int **)(local_410._0_8_ + dVar52 * 8));
        auVar65 = ZEXT1664(auVar65._0_16_);
        (*(local_4e0->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
          _vptr_ChElementBase[0x22])(local_4e0,0,(ChState *)&local_490,local_360 + 0x48,0,local_410)
        ;
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_4b0,
                   (Index)pCVar53);
        if ((long)pCStack_4a8 < 0) goto LAB_0069e956;
        if (pCStack_4a8 != (ChBeamSectionCosserat *)0x0) {
          memset((void *)local_4b0,0,(long)pCStack_4a8 << 3);
        }
        ComputeInternalForces_impl
                  (local_4e0,(ChVectorDynamic<> *)local_4b0,(ChState *)&local_490,&local_378,true);
        IVar35 = local_450.m_storage.m_rows;
        pdVar39 = local_450.m_storage.m_data;
        auVar34 = local_4b0;
        if ((long)local_410._8_8_ <= (long)dVar52) goto LAB_0069e8fe;
        *(_func_int **)(local_410._0_8_ + dVar52 * 8) =
             (_func_int *)((double)*(_func_int **)(local_410._0_8_ + dVar52 * 8) - Delta);
        if (pCStack_4a8 != (ChBeamSectionCosserat *)local_450.m_storage.m_rows) goto LAB_0069e96d;
        if (local_450.m_storage.m_rows < 0) goto LAB_0069e98c;
        local_4c1._1_8_ = -1.0 / Delta;
        local_4c1._9_8_ = 0;
        if (pCStack_468 != (ChBeamSectionCosserat *)local_450.m_storage.m_rows) {
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_470,
                     local_450.m_storage.m_rows,1);
        }
        auVar63 = auVar65._0_16_;
        if (pCStack_468 != (ChBeamSectionCosserat *)IVar35) goto LAB_0069e9ae;
        pCVar53 = (ChBeamSectionCosserat *)
                  ((long)&(pCStack_468->super_ChBeamSection)._vptr_ChBeamSection + 7);
        if (-1 < (long)pCStack_468) {
          pCVar53 = pCStack_468;
        }
        uVar43 = (ulong)pCVar53 & 0xfffffffffffffff8;
        if (7 < (long)pCStack_468) {
          auVar5._8_8_ = 0;
          auVar5._0_8_ = local_4c1._1_8_;
          auVar57 = vbroadcastsd_avx512f(auVar5);
          lVar49 = 0;
          do {
            auVar58 = vsubpd_avx512f(*(undefined1 (*) [64])((long)auVar34 + lVar49 * 8),
                                     *(undefined1 (*) [64])(pdVar39 + lVar49));
            auVar58 = vmulpd_avx512f(auVar57,auVar58);
            *(undefined1 (*) [64])(local_470 + lVar49) = auVar58;
            lVar49 = lVar49 + 8;
          } while (lVar49 < (long)uVar43);
        }
        if ((long)uVar43 < (long)pCStack_468) {
          do {
            local_470[uVar43] =
                 (double)local_4c1._1_8_ *
                 ((double)*(_func_int **)((long)auVar34 + uVar43 * 8) - pdVar39[uVar43]);
            uVar43 = uVar43 + 1;
          } while (pCStack_468 != (ChBeamSectionCosserat *)uVar43);
        }
        if ((long)local_500.m_src < 0 && (element_type *)local_500.m_dst != (element_type *)0x0)
        goto LAB_0069e9cd;
        if ((long)local_500.m_functor <= (long)dVar52) goto LAB_0069e9ef;
        if ((ChBeamSectionCosserat *)local_500.m_src != pCStack_468) goto LAB_0069ea11;
        if (0 < (long)local_500.m_src) {
          pdVar39 = (double *)
                    ((long)(((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                            &(local_500.m_dst)->
                             super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                            )->m_storage).m_data.array + (long)unaff_R15);
          lVar49 = 0;
          do {
            *pdVar39 = local_470[lVar49];
            lVar49 = lVar49 + 1;
            pdVar39 = pdVar39 + (long)local_500.m_functor;
          } while (local_500.m_src != (SrcEvaluatorType *)lVar49);
        }
        dVar52 = (double)((long)dVar52 + 1);
        unaff_R15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)unaff_R15 + 8);
        H = (ChMatrixRef *)local_4d0;
        pCVar53 = local_4d8;
      } while (dVar52 != local_3a0);
    }
    this_00 = local_4e0;
    if (-1 < (long)((ulong)local_500.m_functor | (ulong)local_500.m_src)) {
      local_1a0.super_ChBeamSection._vptr_ChBeamSection =
           (_func_int **)
           (((RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
              *)&((element_type *)H)->_vptr_ChElasticityCosserat)->
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
           ).
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           .m_data;
      local_1a0.plasticity.
      super___shared_ptr<chrono::fea::ChPlasticityCosserat,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              ((element_type *)((long)H + 0x10))->section;
      local_1a0.elasticity.
      super___shared_ptr<chrono::fea::ChElasticityCosserat,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_1a0.plasticity.
      super___shared_ptr<chrono::fea::ChPlasticityCosserat,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_1a0.super_ChBeamSection.draw_shape.
      super___shared_ptr<chrono::fea::ChBeamSectionShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)pCVar53;
      local_1a0.super_ChBeamSection.draw_shape.
      super___shared_ptr<chrono::fea::ChBeamSectionShape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pCVar53;
      local_1a0.elasticity.
      super___shared_ptr<chrono::fea::ChElasticityCosserat,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)H;
      if ((((variable_if_dynamic<long,__1> *)&((element_type *)H)->section)->m_value < (long)pCVar53
          ) || (local_1a0.elasticity.
                super___shared_ptr<chrono::fea::ChElasticityCosserat,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = (element_type *)H,
               (long)((element_type *)((long)H + 0x10))->_vptr_ChElasticityCosserat < (long)pCVar53)
         ) goto LAB_0069ea33;
      local_300._8_8_ = local_498;
      local_300._24_8_ = local_500.m_dst;
      _Stack_2e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_500.m_functor;
      local_1a0.elasticity.
      super___shared_ptr<chrono::fea::ChElasticityCosserat,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)H;
      if (((ChBeamSectionCosserat *)local_500.m_src != pCVar53) ||
         ((ChBeamSectionCosserat *)local_500.m_functor != pCVar53)) {
        pcVar42 = 
        "void Eigen::DenseBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>>]"
        ;
        goto LAB_0069ea26;
      }
      local_3f8.super_ChBeamSection._vptr_ChBeamSection = (_func_int **)local_360;
      kernel = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
                *)(local_410 + 0x18);
      local_3f8.super_ChBeamSection.draw_shape.
      super___shared_ptr<chrono::fea::ChBeamSectionShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_300;
      local_3f8.super_ChBeamSection.draw_shape.
      super___shared_ptr<chrono::fea::ChBeamSectionShape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4c1;
      local_3f8.elasticity.
      super___shared_ptr<chrono::fea::ChElasticityCosserat,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&local_1a0;
      auVar65 = ZEXT1664(auVar63);
      local_360._0_8_ = local_1a0.super_ChBeamSection._vptr_ChBeamSection;
      local_360._16_8_ =
           local_1a0.plasticity.
           super___shared_ptr<chrono::fea::ChPlasticityCosserat,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
             *)kernel);
      if ((_func_int **)local_410._0_8_ != (_func_int **)0x0) {
        kernel = *(generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
                   **)(local_410._0_8_ + -8);
        free(kernel);
      }
      if ((element_type *)local_490.m_data != (element_type *)0x0) {
        kernel = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
                  *)((element_type *)((long)local_490.m_data + 0xfffffffffffffff0))->section;
        free(kernel);
      }
      if ((element_type *)local_500.m_dst != (element_type *)0x0) {
        kernel = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
                  *)((element_type *)((long)local_500.m_dst + 0xfffffffffffffff0))->section;
        free(kernel);
      }
      goto LAB_0069d058;
    }
LAB_0069ea96:
    pcVar42 = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, -1, 1>]"
    ;
    goto LAB_0069e9a1;
  }
  if (-1 < ((H->
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            ).
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_cols.m_value |
           (H->
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           ).
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           .m_rows.m_value)) {
    local_1a0.super_ChBeamSection.draw_shape.
    super___shared_ptr<chrono::fea::ChBeamSectionShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(local_410 + 0x18);
    local_3f8.super_ChBeamSection._vptr_ChBeamSection = (_func_int **)0x0;
    local_300._0_8_ =
         (H->
         super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
         ).
         super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
         .
         super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
         .m_data;
    local_1a0.super_ChBeamSection._vptr_ChBeamSection = (_func_int **)local_300;
    local_300._16_8_ =
         (H->
         super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
         ).m_stride.m_outer.m_value;
    kernel = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
              *)&local_1a0;
    local_1a0.super_ChBeamSection.draw_shape.
    super___shared_ptr<chrono::fea::ChBeamSectionShape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_360;
    local_1a0.elasticity.
    super___shared_ptr<chrono::fea::ChElasticityCosserat,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)H;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
           *)kernel);
    this_00 = local_4e0;
LAB_0069d058:
    if (((double)local_460 != 0.0) || (NAN((double)local_460))) {
      peVar15 = (this_00->section).
                super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      peVar16 = (peVar15->damping).
                super___shared_ptr<chrono::fea::ChDampingCosserat,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      kernel = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
                *)(peVar15->damping).
                  super___shared_ptr<chrono::fea::ChDampingCosserat,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
      if (kernel != (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
                     *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                     *)kernel)->m_src =
               *(int *)&((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                          *)kernel)->m_src + 1;
          UNLOCK();
        }
        else {
          *(int *)&((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                     *)kernel)->m_src =
               *(int *)&((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                          *)kernel)->m_src + 1;
        }
      }
      bVar55 = peVar16 != (element_type *)0x0;
    }
    else {
      bVar55 = false;
    }
    if ((((double)local_460 != 0.0) || (NAN((double)local_460))) &&
       (kernel != (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
                   *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)kernel);
    }
    auVar63 = auVar65._0_16_;
    if (bVar55) {
      ChStateDelta::ChStateDelta((ChStateDelta *)&local_500,(Index)pCVar53,(ChIntegrable *)0x0);
      pdVar39 = local_378.super_ChVectorDynamic<double>.
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      if (local_500.m_src !=
          (SrcEvaluatorType *)
          local_378.super_ChVectorDynamic<double>.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_500,
                   local_378.super_ChVectorDynamic<double>.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,1
                  );
      }
      peVar48 = local_4d0;
      if (local_500.m_src !=
          (SrcEvaluatorType *)
          local_378.super_ChVectorDynamic<double>.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        pcVar42 = 
        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
        ;
LAB_0069e9c3:
        __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,pcVar42);
      }
      pCVar44 = (ChBeamSectionCosserat *)
                ((long)&((ChBeamSection *)
                        &(local_500.m_src)->
                         super_product_evaluator<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                        )->_vptr_ChBeamSection + 7);
      if (-1 < (long)local_500.m_src) {
        pCVar44 = (ChBeamSectionCosserat *)local_500.m_src;
      }
      uVar43 = (ulong)pCVar44 & 0xfffffffffffffff8;
      if (7 < (long)local_500.m_src) {
        lVar49 = 0;
        do {
          ppVar1 = (plainobjectbase_evaluator_data<double,_3> *)(pdVar39 + lVar49);
          pVar26.data = ppVar1[1].data;
          pVar27.data = ppVar1[2].data;
          pVar28.data = ppVar1[3].data;
          pVar29.data = ppVar1[4].data;
          pVar30.data = ppVar1[5].data;
          pVar31.data = ppVar1[6].data;
          pVar32.data = ppVar1[7].data;
          peVar2 = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
                   ((((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                     &(local_500.m_dst)->
                      super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                     )->m_storage).m_data.array + lVar49);
          peVar2->m_d = (plainobjectbase_evaluator_data<double,_3>)ppVar1->data;
          peVar2[1] = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>)
                      pVar26.data;
          peVar2[2] = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>)
                      pVar27.data;
          peVar2[3] = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>)
                      pVar28.data;
          peVar2[4] = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>)
                      pVar29.data;
          peVar2[5] = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>)
                      pVar30.data;
          peVar2[6] = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>)
                      pVar31.data;
          peVar2[7] = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>)
                      pVar32.data;
          lVar49 = lVar49 + 8;
        } while (lVar49 < (long)uVar43);
      }
      if ((long)uVar43 < (long)local_500.m_src) {
        do {
          ((evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
          ((((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
            &(local_500.m_dst)->
             super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>)->
           m_storage).m_data.array + uVar43))->m_d =
               (plainobjectbase_evaluator_data<double,_3>)
               ((plainobjectbase_evaluator_data<double,_3> *)(pdVar39 + uVar43))->data;
          uVar43 = uVar43 + 1;
        } while (local_500.m_src != (SrcEvaluatorType *)uVar43);
      }
      local_500.m_functor = (assign_op<double,_double> *)local_378.integrable;
      local_490.m_data = (double *)0x0;
      local_490.m_rows = 0;
      local_490.m_cols = 0;
      if ((int)local_440 < 0) goto LAB_0069ea74;
      if (((int)local_440 != 0) &&
         (auVar22._8_8_ = 0, auVar22._0_8_ = pCVar53,
         SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / auVar22,0) < (long)pCVar53)) {
        puVar38 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar38 = std::ostream::_M_insert<bool>;
        __cxa_throw(puVar38,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      auVar65 = ZEXT1664(auVar63);
      Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
                (&local_490,(long)pCVar53 * (long)pCVar53,(Index)pCVar53,(Index)pCVar53);
      auVar63 = auVar65._0_16_;
      if ((int)local_440 != 0) {
        bVar55 = (int)local_440 < 2;
        local_440 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((ulong)local_440 & 0xffffffff);
        if (bVar55) {
          local_440 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
        }
        dVar52 = 0.0;
        unaff_R15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4b0;
        p_Var51 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        do {
          auVar65 = ZEXT1664(auVar65._0_16_);
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)unaff_R15,
                     (Index)local_4d8);
          if ((long)pCStack_4a8 < 0) goto LAB_0069e956;
          if (pCStack_4a8 != (ChBeamSectionCosserat *)0x0) {
            memset((void *)local_4b0,0,(long)pCStack_4a8 << 3);
          }
          if ((long)local_500.m_src <= (long)p_Var51) goto LAB_0069e8fe;
          ((evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
          ((((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
            &(local_500.m_dst)->
             super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>)->
           m_storage).m_data.array + (long)p_Var51))->m_d =
               (plainobjectbase_evaluator_data<double,_3>)
               (Delta + (double)((evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                                  *)((((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                                      &(local_500.m_dst)->
                                       super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                                      )->m_storage).m_data.array + (long)p_Var51))->m_d);
          ComputeInternalForces_impl
                    (this_00,(ChVectorDynamic<> *)unaff_R15,(ChState *)(local_360 + 0x48),
                     (ChStateDelta *)&local_500,true);
          IVar35 = local_450.m_storage.m_rows;
          pdVar39 = local_450.m_storage.m_data;
          auVar34 = local_4b0;
          if ((long)local_500.m_src <= (long)p_Var51) goto LAB_0069e8fe;
          ((evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
          ((((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
            &(local_500.m_dst)->
             super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>)->
           m_storage).m_data.array + (long)p_Var51))->m_d =
               (plainobjectbase_evaluator_data<double,_3>)
               ((double)((evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                          *)((((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                              &(local_500.m_dst)->
                               super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                              )->m_storage).m_data.array + (long)p_Var51))->m_d - Delta);
          local_3a0 = dVar52;
          if (pCStack_4a8 != (ChBeamSectionCosserat *)local_450.m_storage.m_rows) {
LAB_0069e96d:
            __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                          "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
                         );
          }
          if (local_450.m_storage.m_rows < 0) goto LAB_0069e98c;
          local_4c1._1_8_ = -1.0 / Delta;
          local_4c1._9_8_ = 0;
          if (pCStack_468 != (ChBeamSectionCosserat *)local_450.m_storage.m_rows) {
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_470,
                       local_450.m_storage.m_rows,1);
          }
          auVar63 = auVar65._0_16_;
          if (pCStack_468 != (ChBeamSectionCosserat *)IVar35) goto LAB_0069e9ae;
          pCVar53 = (ChBeamSectionCosserat *)
                    ((long)&(pCStack_468->super_ChBeamSection)._vptr_ChBeamSection + 7);
          if (-1 < (long)pCStack_468) {
            pCVar53 = pCStack_468;
          }
          uVar43 = (ulong)pCVar53 & 0xfffffffffffffff8;
          if (7 < (long)pCStack_468) {
            auVar6._8_8_ = 0;
            auVar6._0_8_ = local_4c1._1_8_;
            auVar57 = vbroadcastsd_avx512f(auVar6);
            lVar49 = 0;
            do {
              auVar58 = vsubpd_avx512f(*(undefined1 (*) [64])((long)auVar34 + lVar49 * 8),
                                       *(undefined1 (*) [64])(pdVar39 + lVar49));
              auVar58 = vmulpd_avx512f(auVar57,auVar58);
              *(undefined1 (*) [64])(local_470 + lVar49) = auVar58;
              lVar49 = lVar49 + 8;
            } while (lVar49 < (long)uVar43);
          }
          if ((long)uVar43 < (long)pCStack_468) {
            do {
              local_470[uVar43] =
                   (double)local_4c1._1_8_ *
                   ((double)*(_func_int **)((long)auVar34 + uVar43 * 8) - pdVar39[uVar43]);
              uVar43 = uVar43 + 1;
            } while (pCStack_468 != (ChBeamSectionCosserat *)uVar43);
          }
          if (local_490.m_rows < 0 && (element_type *)local_490.m_data != (element_type *)0x0)
          goto LAB_0069e9cd;
          if (local_490.m_cols <= (long)p_Var51) {
LAB_0069e9ef:
            __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                          ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x7a,
                          "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                         );
          }
          if ((ChBeamSectionCosserat *)local_490.m_rows != pCStack_468) goto LAB_0069ea11;
          if (0 < local_490.m_rows) {
            pdVar39 = (double *)
                      ((long)(((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                              local_490.m_data)->m_storage).m_data.array + (long)local_3a0);
            lVar49 = 0;
            do {
              *pdVar39 = local_470[lVar49];
              lVar49 = lVar49 + 1;
              pdVar39 = pdVar39 + local_490.m_cols;
            } while (local_490.m_rows != lVar49);
          }
          p_Var51 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)&p_Var51->_vptr__Sp_counted_base + 1);
          dVar52 = (double)((long)local_3a0 + 8);
          peVar48 = local_4d0;
          this_00 = local_4e0;
        } while (p_Var51 != local_440);
      }
      if ((local_490.m_cols | local_490.m_rows) < 0) goto LAB_0069ea96;
      local_1a0.super_ChBeamSection._vptr_ChBeamSection =
           (_func_int **)
           (((RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
              *)&peVar48->_vptr_ChElasticityCosserat)->
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
           ).
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           .m_data;
      local_1a0.plasticity.
      super___shared_ptr<chrono::fea::ChPlasticityCosserat,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar48[1].section;
      local_1a0.super_ChBeamSection.draw_shape.
      super___shared_ptr<chrono::fea::ChBeamSectionShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_4d8;
      local_1a0.super_ChBeamSection.draw_shape.
      super___shared_ptr<chrono::fea::ChBeamSectionShape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4d8;
      local_1a0.elasticity.
      super___shared_ptr<chrono::fea::ChElasticityCosserat,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_1a0.plasticity.
      super___shared_ptr<chrono::fea::ChPlasticityCosserat,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_1a0.elasticity.
      super___shared_ptr<chrono::fea::ChElasticityCosserat,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           peVar48;
      if ((((variable_if_dynamic<long,__1> *)&peVar48->section)->m_value < (long)local_4d8) ||
         ((long)peVar48[1]._vptr_ChElasticityCosserat < (long)local_4d8)) goto LAB_0069ea33;
      local_300._8_8_ = local_460;
      local_300._24_8_ = local_490.m_data;
      _Stack_2e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_490.m_cols;
      if (((ChBeamSectionCosserat *)local_490.m_rows != local_4d8) ||
         ((ChBeamSectionCosserat *)local_490.m_cols != local_4d8)) {
        __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>, const Eigen::Matrix<double, -1, -1, 1>>, Functor = Eigen::internal::add_assign_op<double, double>]"
                     );
      }
      local_3f8.super_ChBeamSection._vptr_ChBeamSection = (_func_int **)local_360;
      kernel = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
                *)(local_410 + 0x18);
      local_3f8.super_ChBeamSection.draw_shape.
      super___shared_ptr<chrono::fea::ChBeamSectionShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_300;
      local_3f8.super_ChBeamSection.draw_shape.
      super___shared_ptr<chrono::fea::ChBeamSectionShape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_410;
      local_3f8.elasticity.
      super___shared_ptr<chrono::fea::ChElasticityCosserat,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&local_1a0;
      auVar65 = ZEXT1664(auVar63);
      local_360._0_8_ = local_1a0.super_ChBeamSection._vptr_ChBeamSection;
      local_360._16_8_ =
           local_1a0.plasticity.
           super___shared_ptr<chrono::fea::ChPlasticityCosserat,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>_>,_Eigen::internal::add_assign_op<double,_double>,_0>,_4,_0>
      ::run(kernel);
      if ((element_type *)local_490.m_data != (element_type *)0x0) {
        kernel = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
                  *)((element_type *)((long)local_490.m_data + 0xfffffffffffffff0))->section;
        free(kernel);
      }
      if ((element_type *)local_500.m_dst != (element_type *)0x0) {
        kernel = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
                  *)((element_type *)((long)local_500.m_dst + 0xfffffffffffffff0))->section;
        free(kernel);
      }
    }
    if (((double)local_460 != 0.0) || (NAN((double)local_460))) {
      peVar15 = (this_00->section).
                super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      peVar17 = (peVar15->inertia).
                super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      unaff_R15 = (peVar15->inertia).
                  super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
      if (unaff_R15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          unaff_R15->_M_use_count = (int)*(Index *)&unaff_R15->_M_use_count + 1;
          UNLOCK();
        }
        else {
          unaff_R15->_M_use_count = (int)*(Index *)&unaff_R15->_M_use_count + 1;
        }
      }
      if (peVar17->compute_inertia_damping_matrix == false) goto LAB_0069d565;
      bVar55 = true;
      bVar56 = 1;
      cVar54 = '\x01';
    }
    else {
LAB_0069d565:
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_460;
      uVar24 = vcmpsd_avx512f(ZEXT816(0),auVar7,4);
      bVar56 = (byte)uVar24 & 1;
      if (((double)local_498 != 0.0) || (NAN((double)local_498))) {
        peVar15 = (this_00->section).
                  super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        peVar17 = (peVar15->inertia).
                  super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        kernel = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
                  *)(peVar15->inertia).
                    super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
        if (kernel != (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
                       *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                       *)kernel)->m_src =
                 *(int *)&((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                            *)kernel)->m_src + 1;
            UNLOCK();
          }
          else {
            *(int *)&((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                       *)kernel)->m_src =
                 *(int *)&((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                            *)kernel)->m_src + 1;
          }
        }
        cVar54 = peVar17->compute_inertia_stiffness_matrix;
        bVar55 = false;
      }
      else {
        bVar55 = true;
        cVar54 = '\0';
      }
    }
    if (kernel != (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
                   *)0x0 && !bVar55) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)kernel);
    }
    if (bVar56 == 1 && unaff_R15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(unaff_R15);
    }
    auVar63 = auVar65._0_16_;
    if (cVar54 != '\0') {
      dStack_200 = 0.0;
      dStack_1f8 = 0.0;
      dStack_1f0 = 0.0;
      dStack_1e8 = 0.0;
      local_240 = 0.0;
      dStack_238 = 0.0;
      dStack_230 = 0.0;
      dStack_228 = 0.0;
      dStack_220 = 0.0;
      dStack_218 = 0.0;
      dStack_210 = 0.0;
      dStack_208 = 0.0;
      local_280 = 0.0;
      dStack_278 = 0.0;
      dStack_270 = 0.0;
      dStack_268 = 0.0;
      dStack_260 = 0.0;
      dStack_258 = 0.0;
      dStack_250 = 0.0;
      dStack_248 = 0.0;
      local_2c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      peStack_2b8 = (element_type *)0x0;
      _Stack_2b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      dStack_2a8 = 0.0;
      dStack_2a0 = 0.0;
      dStack_298 = 0.0;
      dStack_290 = 0.0;
      dStack_288 = 0.0;
      local_300._0_8_ = (_func_int **)0x0;
      local_300._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_300._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_300._24_8_ = (element_type *)0x0;
      _Stack_2e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      peStack_2d8 = (element_type *)0x0;
      _Stack_2d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      peStack_2c8 = (element_type *)0x0;
      if ((this_00->nodes).
          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this_00->nodes).
          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        local_3a0 = (this_00->super_ChElementBeam).length * 0.5;
        local_440 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_3a0 * (double)local_498);
        local_3a0 = local_3a0 * (double)local_460;
        dStack_398 = local_3a0;
        dStack_390 = local_3a0;
        dStack_388 = local_3a0;
        local_4c1._1_8_ = 1.18575755001899e-322;
        uVar43 = 0;
        p_Stack_438 = local_440;
        p_Stack_430 = local_440;
        p_Stack_428 = local_440;
        do {
          auVar63 = auVar65._0_16_;
          peVar15 = (this_00->section).
                    super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          peVar17 = (peVar15->inertia).
                    super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
          p_Var51 = (peVar15->inertia).
                    super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
          if (p_Var51 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var51->_M_use_count = p_Var51->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var51->_M_use_count = p_Var51->_M_use_count + 1;
            }
          }
          bVar55 = peVar17->compute_inertia_damping_matrix;
          if (p_Var51 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var51);
          }
          if (bVar55 != false) {
            peVar15 = (this_00->section).
                      super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
            peVar17 = (peVar15->inertia).
                      super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
            p_Var51 = (peVar15->inertia).
                      super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
            if (p_Var51 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var51->_M_use_count = p_Var51->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var51->_M_use_count = p_Var51->_M_use_count + 1;
              }
            }
            ChFrameMoving<double>::GetWvel_loc
                      ((ChFrameMoving<double> *)
                       &(((local_4e0->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar43].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->super_ChNodeFEAbase).field_0x18);
            (*peVar17->_vptr_ChInertiaCosserat[3])(peVar17,&local_1a0,(long)local_410 + 0x18);
            if (p_Var51 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var51);
            }
            local_300._0_8_ =
                 (_func_int **)
                 (local_3a0 * (double)local_1a0.super_ChBeamSection._vptr_ChBeamSection +
                 (double)local_300._0_8_);
            local_300._8_8_ =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 (dStack_398 *
                  (double)local_1a0.super_ChBeamSection.draw_shape.
                          super___shared_ptr<chrono::fea::ChBeamSectionShape,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr + (double)local_300._8_8_);
            local_300._16_8_ =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 (dStack_390 *
                  (double)local_1a0.super_ChBeamSection.draw_shape.
                          super___shared_ptr<chrono::fea::ChBeamSectionShape,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi + (double)local_300._16_8_);
            local_300._24_8_ =
                 (element_type *)
                 (dStack_388 *
                  (double)local_1a0.elasticity.
                          super___shared_ptr<chrono::fea::ChElasticityCosserat,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr + (double)local_300._24_8_);
            _Stack_2e0._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 (local_3a0 *
                  (double)local_1a0.elasticity.
                          super___shared_ptr<chrono::fea::ChElasticityCosserat,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi + (double)_Stack_2e0._M_pi);
            peStack_2d8 = (element_type *)
                          (dStack_398 *
                           (double)local_1a0.plasticity.
                                   super___shared_ptr<chrono::fea::ChPlasticityCosserat,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr + (double)peStack_2d8);
            _Stack_2d0._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 (dStack_390 *
                  (double)local_1a0.plasticity.
                          super___shared_ptr<chrono::fea::ChPlasticityCosserat,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi + _Stack_2d0._M_pi);
            peStack_2c8 = (element_type *)
                          (dStack_388 *
                           (double)local_1a0.damping.
                                   super___shared_ptr<chrono::fea::ChDampingCosserat,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr + (double)peStack_2c8);
            local_2c0._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 (local_3a0 *
                  (double)local_1a0.damping.
                          super___shared_ptr<chrono::fea::ChDampingCosserat,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi + local_2c0._M_pi);
            peStack_2b8 = (element_type *)
                          (dStack_398 *
                           (double)local_1a0.inertia.
                                   super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr + (double)peStack_2b8);
            _Stack_2b0._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 (dStack_390 *
                  (double)local_1a0.inertia.
                          super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi + _Stack_2b0._M_pi);
            dStack_2a8 = dStack_388 * dStack_148 + dStack_2a8;
            dStack_2a0 = local_3a0 * local_140 + dStack_2a0;
            dStack_298 = dStack_398 * dStack_138 + dStack_298;
            dStack_290 = dStack_390 * dStack_130 + dStack_290;
            dStack_288 = dStack_388 * dStack_128 + dStack_288;
            local_280 = local_3a0 * local_120 + local_280;
            dStack_278 = dStack_398 * dStack_118 + dStack_278;
            dStack_270 = dStack_390 * dStack_110 + dStack_270;
            dStack_268 = dStack_388 * dStack_108 + dStack_268;
            dStack_260 = local_3a0 * local_100 + dStack_260;
            dStack_258 = dStack_398 * dStack_f8 + dStack_258;
            dStack_250 = dStack_390 * dStack_f0 + dStack_250;
            dStack_248 = dStack_388 * dStack_e8 + dStack_248;
            local_240 = local_3a0 * local_e0 + local_240;
            dStack_238 = dStack_398 * dStack_d8 + dStack_238;
            dStack_230 = dStack_390 * dStack_d0 + dStack_230;
            dStack_228 = dStack_388 * dStack_c8 + dStack_228;
            dStack_220 = local_3a0 * local_c0 + dStack_220;
            dStack_218 = dStack_398 * dStack_b8 + dStack_218;
            dStack_210 = dStack_390 * dStack_b0 + dStack_210;
            dStack_208 = dStack_388 * dStack_a8 + dStack_208;
            dStack_200 = local_3a0 * local_a0 + dStack_200;
            dStack_1f8 = dStack_398 * dStack_98 + dStack_1f8;
            dStack_1f0 = dStack_390 * dStack_90 + dStack_1f0;
            dStack_1e8 = dStack_388 * dStack_88 + dStack_1e8;
            this_00 = local_4e0;
          }
          peVar15 = (this_00->section).
                    super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          peVar17 = (peVar15->inertia).
                    super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
          p_Var51 = (peVar15->inertia).
                    super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
          if (p_Var51 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var51->_M_use_count = p_Var51->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var51->_M_use_count = p_Var51->_M_use_count + 1;
            }
          }
          bVar55 = peVar17->compute_inertia_stiffness_matrix;
          if (p_Var51 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var51);
          }
          pCVar33 = local_4e0;
          if (bVar55 != false) {
            peVar15 = (this_00->section).
                      super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
            local_4d8 = (ChBeamSectionCosserat *)
                        (peVar15->inertia).
                        super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr;
            p_Var51 = (peVar15->inertia).
                      super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
            if (p_Var51 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var51->_M_use_count = p_Var51->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var51->_M_use_count = p_Var51->_M_use_count + 1;
              }
            }
            ChFrameMoving<double>::GetWvel_loc
                      ((ChFrameMoving<double> *)
                       &(((local_4e0->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar43].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->super_ChNodeFEAbase).field_0x18);
            ChFrameMoving<double>::GetWacc_loc
                      ((ChFrameMoving<double> *)
                       &(((pCVar33->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar43].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->super_ChNodeFEAbase).field_0x18);
            peVar18 = (pCVar33->nodes).
                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar43].
                      super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
            auVar59._8_8_ = 0;
            auVar59._0_8_ = *(ulong *)&peVar18->field_0xd8;
            dVar52 = *(double *)&peVar18->field_0xe0;
            auVar8._8_8_ = 0;
            auVar8._0_8_ = *(ulong *)&peVar18->field_0x58;
            auVar64._8_8_ = 0;
            auVar64._0_8_ = dVar52 * *(double *)&peVar18->field_0x70;
            auVar63 = vfmadd231sd_fma(auVar64,auVar59,auVar8);
            auVar66._8_8_ = 0;
            auVar66._0_8_ = *(ulong *)&peVar18->field_0xe8;
            auVar9._8_8_ = 0;
            auVar9._0_8_ = *(ulong *)&peVar18->field_0x88;
            auVar63 = vfmadd231sd_fma(auVar63,auVar66,auVar9);
            auVar10._8_8_ = 0;
            auVar10._0_8_ = *(ulong *)&peVar18->field_0x60;
            auVar67._8_8_ = 0;
            auVar67._0_8_ = dVar52 * *(double *)&peVar18->field_0x78;
            auVar5 = vfmadd231sd_fma(auVar67,auVar59,auVar10);
            auVar11._8_8_ = 0;
            auVar11._0_8_ = *(ulong *)&peVar18->field_0x90;
            auVar5 = vfmadd231sd_fma(auVar5,auVar66,auVar11);
            auVar12._8_8_ = 0;
            auVar12._0_8_ = *(ulong *)&peVar18->field_0x68;
            auVar61._8_8_ = 0;
            auVar61._0_8_ = dVar52 * *(double *)&peVar18->field_0x80;
            auVar22 = vfmadd231sd_fma(auVar61,auVar59,auVar12);
            auVar13._8_8_ = 0;
            auVar13._0_8_ = *(ulong *)&peVar18->field_0x98;
            auVar22 = vfmadd231sd_fma(auVar22,auVar66,auVar13);
            local_500.m_dst = auVar63._0_8_;
            local_500.m_src = auVar5._0_8_;
            local_500.m_functor = auVar22._0_8_;
            (*(local_4d8->super_ChBeamSection)._vptr_ChBeamSection[4])
                      (local_4d8,&local_1a0,(long)local_410 + 0x18,local_360);
            if (p_Var51 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var51);
            }
            local_300._0_8_ =
                 (_func_int **)
                 ((double)local_440 * (double)local_1a0.super_ChBeamSection._vptr_ChBeamSection +
                 (double)local_300._0_8_);
            local_300._8_8_ =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((double)p_Stack_438 *
                  (double)local_1a0.super_ChBeamSection.draw_shape.
                          super___shared_ptr<chrono::fea::ChBeamSectionShape,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr + (double)local_300._8_8_);
            local_300._16_8_ =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((double)p_Stack_430 *
                  (double)local_1a0.super_ChBeamSection.draw_shape.
                          super___shared_ptr<chrono::fea::ChBeamSectionShape,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi + (double)local_300._16_8_);
            local_300._24_8_ =
                 (element_type *)
                 ((double)p_Stack_428 *
                  (double)local_1a0.elasticity.
                          super___shared_ptr<chrono::fea::ChElasticityCosserat,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr + (double)local_300._24_8_);
            _Stack_2e0._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((double)local_440 *
                  (double)local_1a0.elasticity.
                          super___shared_ptr<chrono::fea::ChElasticityCosserat,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi + (double)_Stack_2e0._M_pi);
            peStack_2d8 = (element_type *)
                          ((double)p_Stack_438 *
                           (double)local_1a0.plasticity.
                                   super___shared_ptr<chrono::fea::ChPlasticityCosserat,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr + (double)peStack_2d8);
            _Stack_2d0._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((double)p_Stack_430 *
                  (double)local_1a0.plasticity.
                          super___shared_ptr<chrono::fea::ChPlasticityCosserat,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi + _Stack_2d0._M_pi);
            peStack_2c8 = (element_type *)
                          ((double)p_Stack_428 *
                           (double)local_1a0.damping.
                                   super___shared_ptr<chrono::fea::ChDampingCosserat,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr + (double)peStack_2c8);
            local_2c0._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((double)local_440 *
                  (double)local_1a0.damping.
                          super___shared_ptr<chrono::fea::ChDampingCosserat,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi + local_2c0._M_pi);
            peStack_2b8 = (element_type *)
                          ((double)p_Stack_438 *
                           (double)local_1a0.inertia.
                                   super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr + (double)peStack_2b8);
            _Stack_2b0._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((double)p_Stack_430 *
                  (double)local_1a0.inertia.
                          super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi + _Stack_2b0._M_pi);
            dStack_2a8 = (double)p_Stack_428 * dStack_148 + dStack_2a8;
            dStack_2a0 = (double)local_440 * local_140 + dStack_2a0;
            dStack_298 = (double)p_Stack_438 * dStack_138 + dStack_298;
            dStack_290 = (double)p_Stack_430 * dStack_130 + dStack_290;
            dStack_288 = (double)p_Stack_428 * dStack_128 + dStack_288;
            local_280 = (double)local_440 * local_120 + local_280;
            dStack_278 = (double)p_Stack_438 * dStack_118 + dStack_278;
            dStack_270 = (double)p_Stack_430 * dStack_110 + dStack_270;
            dStack_268 = (double)p_Stack_428 * dStack_108 + dStack_268;
            dStack_260 = (double)local_440 * local_100 + dStack_260;
            dStack_258 = (double)p_Stack_438 * dStack_f8 + dStack_258;
            dStack_250 = (double)p_Stack_430 * dStack_f0 + dStack_250;
            dStack_248 = (double)p_Stack_428 * dStack_e8 + dStack_248;
            local_240 = (double)local_440 * local_e0 + local_240;
            dStack_238 = (double)p_Stack_438 * dStack_d8 + dStack_238;
            dStack_230 = (double)p_Stack_430 * dStack_d0 + dStack_230;
            dStack_228 = (double)p_Stack_428 * dStack_c8 + dStack_228;
            dStack_220 = (double)local_440 * local_c0 + dStack_220;
            dStack_218 = (double)p_Stack_438 * dStack_b8 + dStack_218;
            dStack_210 = (double)p_Stack_430 * dStack_b0 + dStack_210;
            dStack_208 = (double)p_Stack_428 * dStack_a8 + dStack_208;
            dStack_200 = (double)local_440 * local_a0 + dStack_200;
            dStack_1f8 = (double)p_Stack_438 * dStack_98 + dStack_1f8;
            dStack_1f0 = (double)p_Stack_430 * dStack_90 + dStack_1f0;
            dStack_1e8 = (double)p_Stack_428 * dStack_88 + dStack_1e8;
          }
          peVar48 = local_4d0;
          this_00 = local_4e0;
          lVar41 = uVar43 * 6;
          lVar49 = lVar41 + 6;
          if ((((variable_if_dynamic<long,__1> *)&local_4d0->section)->m_value < lVar49) ||
             ((long)local_4d0[1]._vptr_ChElasticityCosserat < lVar49)) {
LAB_0069e93f:
            pcVar42 = 
            "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 3, 3>::Block(XprType &, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, BlockRows = 3, BlockCols = 3, InnerPanel = false]"
            ;
            goto LAB_0069e8f1;
          }
          pCVar53 = local_4d0[1].section;
          pdVar39 = (double *)
                    ((long)(((RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                              *)&local_4d0->_vptr_ChElasticityCosserat)->
                           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                           ).
                           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                           .m_data +
                    (long)((long)&(pCVar53->super_ChBeamSection)._vptr_ChBeamSection + 1U) *
                    local_4c1._1_8_ + 0x10);
          lVar50 = 0xb8;
          do {
            dVar52 = *(double *)((long)adStack_310 + lVar50 + 8U);
            pdVar39[-2] = *(double *)((long)adStack_310 + lVar50) + pdVar39[-2];
            pdVar39[-1] = dVar52 + pdVar39[-1];
            *pdVar39 = *(double *)
                        ((long)&(((ChBeamSectionCosserat *)local_300)->super_ChBeamSection).
                                _vptr_ChBeamSection + lVar50) + *pdVar39;
            lVar50 = lVar50 + 0x30;
            pdVar39 = pdVar39 + (long)pCVar53;
          } while (lVar50 != 0x148);
          if ((((variable_if_dynamic<long,__1> *)&local_4d0->section)->m_value < lVar41 + 3) ||
             ((long)local_4d0[1]._vptr_ChElasticityCosserat < lVar49)) goto LAB_0069e93f;
          local_3f8.super_ChBeamSection._vptr_ChBeamSection =
               (_func_int **)
               &((local_4e0->nodes).
                 super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar43].
                 super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->field_0x58;
          pdVar19 = (((RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                       *)&local_4d0->_vptr_ChElasticityCosserat)->
                    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                    ).
                    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                    .m_data;
          pCVar53 = local_4d0[1].section;
          local_3f8.super_ChBeamSection.draw_shape.
          super___shared_ptr<chrono::fea::ChBeamSectionShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)&((ChBeamSectionCosserat *)local_300)->elasticity;
          local_3f8.elasticity.
          super___shared_ptr<chrono::fea::ChElasticityCosserat,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_300;
          local_3f8.elasticity.
          super___shared_ptr<chrono::fea::ChElasticityCosserat,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_3f8.plasticity.
          super___shared_ptr<chrono::fea::ChPlasticityCosserat,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x3;
          local_3f8.plasticity.
          super___shared_ptr<chrono::fea::ChPlasticityCosserat,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x6;
          local_3f8.inertia.
          super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3;
          local_500.m_dst = (DstEvaluatorType *)&local_490;
          local_500.m_src = (SrcEvaluatorType *)(local_410 + 0x18);
          local_500.m_functor = (assign_op<double,_double> *)local_410;
          auVar65 = ZEXT1664(auVar63);
          local_500.m_dstExpr = (DstXprType *)local_360;
          local_490.m_data = (double *)local_360;
          local_3f8.damping.
          super___shared_ptr<chrono::fea::ChDampingCosserat,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_3f8.super_ChBeamSection._vptr_ChBeamSection;
          local_3f8.damping.
          super___shared_ptr<chrono::fea::ChDampingCosserat,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_3f8.super_ChBeamSection.draw_shape.
                   super___shared_ptr<chrono::fea::ChBeamSectionShape,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          Eigen::internal::
          copy_using_evaluator_DefaultTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
          ::run(&local_500);
          auVar63 = auVar65._0_16_;
          pdVar39 = pdVar19 + lVar41 + 3 + lVar41 * (long)pCVar53;
          pCVar53 = peVar48[1].section;
          *pdVar39 = (double)local_360._0_8_ + *pdVar39;
          pdVar39[1] = (double)local_360._24_8_ + pdVar39[1];
          pdVar39[2] = (double)local_360._48_8_ + pdVar39[2];
          pdVar39[(long)pCVar53] = (double)local_360._8_8_ + pdVar39[(long)pCVar53];
          pdVar39[(long)((long)&(pCVar53->super_ChBeamSection)._vptr_ChBeamSection + 1)] =
               (double)local_360._32_8_ +
               pdVar39[(long)((long)&(pCVar53->super_ChBeamSection)._vptr_ChBeamSection + 1)];
          pdVar39[(long)((long)&(pCVar53->super_ChBeamSection)._vptr_ChBeamSection + 2)] =
               (double)local_360._56_8_ +
               pdVar39[(long)((long)&(pCVar53->super_ChBeamSection)._vptr_ChBeamSection + 2)];
          pdVar39[(long)pCVar53 * 2] = (double)local_360._16_8_ + pdVar39[(long)pCVar53 * 2];
          pdVar39[(long)pCVar53 * 2 + 1] = (double)local_360._40_8_ + pdVar39[(long)pCVar53 * 2 + 1]
          ;
          pdVar39[(long)pCVar53 * 2 + 2] = (double)local_360._64_8_ + pdVar39[(long)pCVar53 * 2 + 2]
          ;
          uVar43 = uVar43 + 1;
          local_4c1._1_8_ = local_4c1._1_8_ + 0x30;
        } while (uVar43 < (ulong)((long)(this_00->nodes).
                                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this_00->nodes).
                                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 4));
      }
    }
    peVar48 = local_4d0;
    if ((local_418 == 0.0) && (!NAN(local_418))) {
LAB_0069e850:
      if (local_470 != (double *)0x0) {
        free((void *)local_470[0xffffffffffffffff]);
      }
      if (local_4b0 != (undefined1  [8])0x0) {
        free(*(_func_int **)((long)local_4b0 + -8));
      }
      if (local_450.m_storage.m_data != (double *)0x0) {
        free((void *)local_450.m_storage.m_data[0xffffffffffffffff]);
      }
      if (local_378.super_ChVectorDynamic<double>.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
          (double *)0x0) {
        free((void *)local_378.super_ChVectorDynamic<double>.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                     [-1]);
      }
      if ((element_type *)local_360._72_8_ != (element_type *)0x0) {
        free(*(void **)&((element_type *)(local_360._72_8_ + -0x18))->compute_inertia_damping_matrix
            );
      }
      return;
    }
    psVar20 = (this_00->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    psVar21 = (this_00->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    lVar49 = (long)psVar21 - (long)psVar20;
    local_500.m_dst = (DstEvaluatorType *)0x0;
    local_500.m_src = (SrcEvaluatorType *)0x0;
    local_500.m_functor = (assign_op<double,_double> *)0x0;
    if (lVar49 < 0) {
LAB_0069ea74:
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>]"
                   );
    }
    uVar43 = (lVar49 >> 3) * 3;
    if ((psVar21 != psVar20) &&
       (auVar23._8_8_ = 0, auVar23._0_8_ = uVar43,
       auVar5 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
       SUB168(auVar5 / auVar23,0) < (long)uVar43)) {
      puVar38 = (undefined8 *)__cxa_allocate_exception(8,0,SUB168(auVar5 % auVar23,0));
      *puVar38 = std::ostream::_M_insert<bool>;
      __cxa_throw(puVar38,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
              ((DenseStorage<double,__1,__1,__1,_1> *)&local_500,uVar43 * uVar43,uVar43,uVar43);
    local_1a0.super_ChBeamSection._vptr_ChBeamSection = (_func_int **)local_500.m_src;
    local_1a0.super_ChBeamSection.draw_shape.
    super___shared_ptr<chrono::fea::ChBeamSectionShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_500.m_functor;
    local_1a0.super_ChBeamSection.draw_shape.
    super___shared_ptr<chrono::fea::ChBeamSectionShape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (-1 < (long)((ulong)local_500.m_functor | (ulong)local_500.m_src)) {
      Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                ((Matrix<double,__1,__1,_1,__1,__1> *)&local_500,
                 (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                  *)&local_1a0,(assign_op<double,_double> *)local_300);
      if (lumped_mass == '\x01') {
        peVar15 = (this_00->section).
                  super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        peVar17 = (peVar15->inertia).
                  super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        p_Var51 = (peVar15->inertia).
                  super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        if (p_Var51 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var51->_M_use_count = p_Var51->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var51->_M_use_count = p_Var51->_M_use_count + 1;
          }
        }
        (*peVar17->_vptr_ChInertiaCosserat[2])(peVar17,&local_1a0);
        if (p_Var51 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var51);
        }
        if ((local_4e0->nodes).
            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            (local_4e0->nodes).
            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          auVar63 = vcvtusi2sd_avx512f(auVar63,(long)(local_4e0->nodes).
                                                                                                          
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                               (long)(local_4e0->nodes).
                                                                                                          
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 4);
          local_460 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      (((local_4e0->super_ChElementBeam).length / auVar63._0_8_) * local_418);
          dVar52 = 1.18575755001899e-322;
          lVar49 = 0;
          uVar43 = 0;
          p_Stack_438 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Stack_458 = local_460;
          local_440 = local_460;
          do {
            dVar4 = (double)(uVar43 * 6);
            lVar41 = uVar43 * 6 + 3;
            if (((long)local_500.m_src < lVar41) || ((long)local_500.m_functor < lVar41)) {
LAB_0069e8dc:
              pcVar42 = 
              "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 3, 3>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = 3, BlockCols = 3, InnerPanel = false]"
              ;
LAB_0069e8f1:
              __assert_fail("startRow >= 0 && BlockRows >= 0 && startRow + BlockRows <= xpr.rows() && startCol >= 0 && BlockCols >= 0 && startCol + BlockCols <= xpr.cols()"
                            ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x85,pcVar42);
            }
            pdVar39 = (double *)
                      ((long)&((element_type *)((long)local_500.m_dst + 0x10))->
                              _vptr_ChElasticityCosserat +
                      (long)((long)&((ChBeamSection *)&(local_500.m_functor)->field_0x0)->
                                    _vptr_ChBeamSection + 1) * lVar49);
            lVar50 = 0x10;
            do {
              dVar25 = *(double *)((long)local_1b0 + lVar50 + 8);
              pdVar39[-2] = (double)local_460 * *(double *)((long)local_1b0 + lVar50) + pdVar39[-2];
              pdVar39[-1] = (double)p_Stack_458 * dVar25 + pdVar39[-1];
              *pdVar39 = (double)local_440 * *(double *)((long)&local_1a0 + lVar50) + *pdVar39;
              lVar50 = lVar50 + 0x30;
              pdVar39 = pdVar39 + (long)local_500.m_functor;
            } while (lVar50 != 0xa0);
            lVar50 = (long)dVar4 + 6;
            if (((long)local_500.m_src < lVar50) || ((long)local_500.m_functor < lVar50))
            goto LAB_0069e8dc;
            local_4d8 = (ChBeamSectionCosserat *)((long)dVar4 + 3);
            local_3a0 = dVar52;
            pdVar39 = (double *)
                      ((long)&((element_type *)((long)local_500.m_dst + 0x10))->
                              _vptr_ChElasticityCosserat +
                      (long)((long)&((ChBeamSection *)&(local_500.m_functor)->field_0x0)->
                                    _vptr_ChBeamSection + 1) * (long)dVar52);
            lVar45 = 0xb8;
            do {
              dVar52 = *(double *)((long)local_1b0 + lVar45 + 8);
              pdVar39[-2] = (double)local_460 * *(double *)((long)local_1b0 + lVar45) + pdVar39[-2];
              pdVar39[-1] = (double)p_Stack_458 * dVar52 + pdVar39[-1];
              *pdVar39 = (double)local_440 * *(double *)((long)&local_1a0 + lVar45) + *pdVar39;
              lVar45 = lVar45 + 0x30;
              pdVar39 = pdVar39 + (long)local_500.m_functor;
            } while (lVar45 != 0x148);
            local_300._0_8_ =
                 &((local_4e0->nodes).
                   super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar43].
                   super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->field_0x58;
            local_300._8_8_ = (long)&local_1a0 + 0x18;
            local_300._24_8_ = &local_1a0;
            _Stack_2e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            peStack_2d8 = (element_type *)0x3;
            _Stack_2d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x6;
            local_4c1._1_8_ = dVar4;
            local_2c0._M_pi = local_440;
            ChMatrix33<double>::operator=
                      ((ChMatrix33<double> *)(local_410 + 0x18),
                       (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                        *)local_300);
            if (((long)local_500.m_src < lVar41) || ((long)local_500.m_functor < lVar50))
            goto LAB_0069e8dc;
            pPVar40 = (PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                      ((long)(((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                              &(local_500.m_dst)->
                               super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                              )->m_storage).m_data.array + (long)local_500.m_functor * lVar49);
            lVar45 = 0x10;
            do {
              dVar52 = *(double *)(local_410 + lVar45 + 0x10);
              pdVar39 = (double *)((long)(pPVar40->m_storage).m_data.array + lVar49 + 0x18);
              dVar4 = pdVar39[1];
              pdVar3 = (double *)((long)(pPVar40->m_storage).m_data.array + lVar49 + 0x18);
              *pdVar3 = *(double *)(local_410 + lVar45 + 8) + *pdVar39;
              pdVar3[1] = dVar52 + dVar4;
              *(double *)((long)(pPVar40->m_storage).m_data.array + lVar49 + 0x28) =
                   *(double *)(local_410 + lVar45 + 0x18) +
                   *(double *)((long)(pPVar40->m_storage).m_data.array + lVar49 + 0x28);
              lVar45 = lVar45 + 0x18;
              pPVar40 = (PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                        ((pPVar40->m_storage).m_data.array + (long)local_500.m_functor);
            } while (lVar45 != 0x58);
            if (((long)local_500.m_src < lVar50) || ((long)local_500.m_functor < lVar41))
            goto LAB_0069e8dc;
            peVar2 = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
                     ((((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                       &(local_500.m_dst)->
                        super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                       )->m_storage).m_data.array +
                     local_4c1._1_8_ + (long)local_4d8 * (long)local_500.m_functor);
            if (((element_type *)local_500.m_dst != (element_type *)0x0) &&
               ((ChMatrix33<double> *)(local_410 + 0x18) == (ChMatrix33<double> *)peVar2)) {
LAB_0069e920:
              __assert_fail("(!check_transpose_aliasing_run_time_selector <typename Derived::Scalar,blas_traits<Derived>::IsTransposed,OtherDerived> ::run(extract_data(dst), other)) && \"aliasing detected during transposition, use transposeInPlace() \" \"or evaluate the rhs into a temporary using .eval()\""
                            ,"/usr/include/eigen3/Eigen/src/Core/Transpose.h",0x1b6,
                            "static void Eigen::internal::checkTransposeAliasing_impl<Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 3, 3>, Eigen::Transpose<Eigen::Matrix<double, 3, 3, 1>>>::run(const Derived &, const OtherDerived &) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 3, 3>, OtherDerived = Eigen::Transpose<Eigen::Matrix<double, 3, 3, 1>>, MightHaveTransposeAliasing = true]"
                           );
            }
            *(double *)
             &((Matrix<double,_3,_3,_1,_3,_3> *)&peVar2->m_d)->
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> =
                 (double)local_3f8.super_ChBeamSection._vptr_ChBeamSection +
                 *(double *)
                  &((Matrix<double,_3,_3,_1,_3,_3> *)&peVar2->m_d)->
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>;
            *(double *)
             &((Matrix<double,_3,_3,_1,_3,_3> *)(peVar2 + 1))->
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> =
                 (double)local_3f8.elasticity.
                         super___shared_ptr<chrono::fea::ChElasticityCosserat,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr +
                 *(double *)
                  &((Matrix<double,_3,_3,_1,_3,_3> *)(peVar2 + 1))->
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>;
            *(double *)
             &((Matrix<double,_3,_3,_1,_3,_3> *)(peVar2 + 2))->
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> =
                 (double)local_3f8.plasticity.
                         super___shared_ptr<chrono::fea::ChPlasticityCosserat,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi +
                 *(double *)
                  &((Matrix<double,_3,_3,_1,_3,_3> *)(peVar2 + 2))->
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>;
            peVar2[(long)local_500.m_functor] =
                 (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>)
                 ((double)local_3f8.super_ChBeamSection.draw_shape.
                          super___shared_ptr<chrono::fea::ChBeamSectionShape,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr + *(double *)(peVar2 + (long)local_500.m_functor));
            peVar2[(long)&((ChBeamSection *)&(local_500.m_functor)->field_0x0)->_vptr_ChBeamSection
                   + 1] = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                          )((double)local_3f8.elasticity.
                                    super___shared_ptr<chrono::fea::ChElasticityCosserat,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi +
                           *(double *)
                            (peVar2 + (long)&((ChBeamSection *)&(local_500.m_functor)->field_0x0)->
                                             _vptr_ChBeamSection + 1));
            peVar2[(long)&((ChBeamSection *)&(local_500.m_functor)->field_0x0)->_vptr_ChBeamSection
                   + 2] = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                          )((double)local_3f8.damping.
                                    super___shared_ptr<chrono::fea::ChDampingCosserat,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr +
                           *(double *)
                            (peVar2 + (long)&((ChBeamSection *)&(local_500.m_functor)->field_0x0)->
                                             _vptr_ChBeamSection + 2));
            peVar2[(long)local_500.m_functor * 2] =
                 (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>)
                 ((double)local_3f8.super_ChBeamSection.draw_shape.
                          super___shared_ptr<chrono::fea::ChBeamSectionShape,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi + *(double *)(peVar2 + (long)local_500.m_functor * 2));
            peVar2[(long)local_500.m_functor * 2U + 1] =
                 (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>)
                 ((double)local_3f8.plasticity.
                          super___shared_ptr<chrono::fea::ChPlasticityCosserat,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr + *(double *)(peVar2 + (long)local_500.m_functor * 2U + 1));
            peVar2[(long)local_500.m_functor * 2U + 2] =
                 (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>)
                 ((double)local_3f8.damping.
                          super___shared_ptr<chrono::fea::ChDampingCosserat,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi +
                 *(double *)(peVar2 + (long)local_500.m_functor * 2U + 2));
            uVar43 = uVar43 + 1;
            lVar49 = lVar49 + 0x30;
            dVar52 = (double)((long)local_3a0 + 0x30);
            peVar48 = local_4d0;
          } while (uVar43 < (ulong)((long)(local_4e0->nodes).
                                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(local_4e0->nodes).
                                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 4));
        }
      }
      else {
        peVar15 = (this_00->section).
                  super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        peVar17 = (peVar15->inertia).
                  super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        p_Var51 = (peVar15->inertia).
                  super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        if (p_Var51 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var51->_M_use_count = p_Var51->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var51->_M_use_count = p_Var51->_M_use_count + 1;
          }
        }
        (*peVar17->_vptr_ChInertiaCosserat[2])(peVar17,&local_1a0);
        if (p_Var51 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var51);
        }
        lVar49 = (long)this_00->order;
        if ((((lVar49 < 0) ||
             (lVar41 = (this_00->knots).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_rows, lVar41 <= lVar49)) || (lVar50 = ~this_00->order + lVar41, lVar50 < 0)
            ) || (lVar41 <= lVar50)) {
LAB_0069e8fe:
          __assert_fail("index >= 0 && index < size()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                       );
        }
        if (0 < this_00->int_order_b) {
          local_1c0 = &this_00->knots;
          pdVar39 = (this_00->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_data;
          dVar52 = pdVar39[lVar49];
          dVar4 = pdVar39[lVar50];
          local_380 = (dVar4 - dVar52) * 0.5;
          local_1b8 = (dVar52 + dVar4) * 0.5;
          dVar52 = 0.0;
          do {
            pCVar37 = ChQuadrature::GetStaticTables();
            auVar62._8_8_ = 0;
            auVar62._0_8_ =
                 *(ulong *)(*(long *)&(pCVar37->Lroots).
                                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start
                                      [(long)this_00->int_order_b + -1].
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data + (long)dVar52 * 8);
            auVar60._8_8_ = 0;
            auVar60._0_8_ = local_1b8;
            auVar14._8_8_ = 0;
            auVar14._0_8_ = local_380;
            auVar63 = vfmadd132sd_fma(auVar62,auVar60,auVar14);
            local_4c1._1_8_ = auVar63._0_8_;
            pCVar37 = ChQuadrature::GetStaticTables();
            local_4d8 = *(ChBeamSectionCosserat **)
                         (*(long *)&(pCVar37->Weight).
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start
                                    [(long)this_00->int_order_b + -1].
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl +
                         (long)dVar52 * 8);
            local_3a0 = (this_00->Jacobian_b).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[(long)dVar52];
            iVar36 = this_00->order;
            local_360._0_8_ = (ChBeamSectionCosserat *)0x0;
            local_360._8_8_ = (ChBeamSectionCosserat *)0x0;
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_360,
                       (long)(int)((ulong)((long)(this_00->nodes).
                                                 super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(this_00->nodes).
                                                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start) >> 4));
            local_1b0[0] = dVar52;
            geometry::ChBasisToolsBspline::BasisEvaluate
                      (this_00->order,iVar36,(double)local_4c1._1_8_,local_1c0,
                       (ChVectorDynamic<> *)local_360);
            if ((this_00->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                (this_00->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              local_1b0[1] = (double)local_4d8 * local_418 * local_3a0 * local_380;
              local_3a0 = 1.18575755001899e-322;
              p_Var51 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              uVar43 = 0;
              do {
                if ((this_00->nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish !=
                    (this_00->nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
                  local_440 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar43 * 6 + 3);
                  local_460 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar43 * 6 + 6);
                  pCVar53 = (ChBeamSectionCosserat *)0x10;
                  lVar49 = 0x28;
                  uVar47 = 0;
                  local_498 = p_Var51;
                  do {
                    if (((long)local_360._8_8_ <= (long)uVar43) ||
                       ((long)local_360._8_8_ <= (long)uVar47)) goto LAB_0069e8fe;
                    if ((long)local_500.m_src < (long)local_440) goto LAB_0069e8dc;
                    dVar52 = (double)(uVar47 * 6 + 3);
                    if ((long)local_500.m_functor < (long)dVar52) goto LAB_0069e8dc;
                    p_Var51 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                              ((double)(&((ChBeamSection *)local_360._0_8_)->_vptr_ChBeamSection)
                                       [uVar43] *
                               (double)(&((ChBeamSection *)local_360._0_8_)->_vptr_ChBeamSection)
                                       [uVar47] * local_1b0[1]);
                    lVar41 = (long)local_498 * (long)local_500.m_functor;
                    puVar46 = (undefined1 *)
                              ((long)(((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                                      &(local_500.m_dst)->
                                       super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                                      )->m_storage).m_data.array + (long)pCVar53);
                    lVar50 = 0x10;
                    do {
                      dVar4 = *(double *)((long)local_1b0 + lVar50 + 8);
                      dVar25 = *(double *)((long)(puVar46 + lVar41 + -0x10) + 8);
                      *(double *)(puVar46 + lVar41 + -0x10) =
                           (double)p_Var51 * *(double *)((long)local_1b0 + lVar50) +
                           *(double *)(puVar46 + lVar41 + -0x10);
                      *(double *)((long)(puVar46 + lVar41 + -0x10) + 8) =
                           (double)p_Var51 * dVar4 + dVar25;
                      *(double *)(puVar46 + lVar41) =
                           (double)p_Var51 * *(double *)((long)&local_1a0 + lVar50) +
                           *(double *)(puVar46 + lVar41);
                      lVar50 = lVar50 + 0x30;
                      puVar46 = puVar46 + (long)local_500.m_functor * 8;
                    } while (lVar50 != 0xa0);
                    if (((long)local_500.m_src < (long)local_460) ||
                       (lVar41 = uVar47 * 6 + 6, (long)local_500.m_functor < lVar41))
                    goto LAB_0069e8dc;
                    lVar50 = (long)local_3a0 * (long)local_500.m_functor;
                    puVar46 = (undefined1 *)
                              ((long)(((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                                      &(local_500.m_dst)->
                                       super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                                      )->m_storage).m_data.array + lVar49);
                    lVar45 = 0xb8;
                    do {
                      dVar4 = *(double *)((long)local_1b0 + lVar45 + 8);
                      dVar25 = *(double *)((long)(puVar46 + lVar50 + -0x10) + 8);
                      *(double *)(puVar46 + lVar50 + -0x10) =
                           (double)p_Var51 * *(double *)((long)local_1b0 + lVar45) +
                           *(double *)(puVar46 + lVar50 + -0x10);
                      *(double *)((long)(puVar46 + lVar50 + -0x10) + 8) =
                           (double)p_Var51 * dVar4 + dVar25;
                      *(double *)(puVar46 + lVar50) =
                           (double)p_Var51 * *(double *)((long)&local_1a0 + lVar45) +
                           *(double *)(puVar46 + lVar50);
                      lVar45 = lVar45 + 0x30;
                      puVar46 = puVar46 + (long)local_500.m_functor * 8;
                    } while (lVar45 != 0x148);
                    local_300._0_8_ =
                         &((local_4e0->nodes).
                           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar43].
                           super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->field_0x58;
                    local_300._8_8_ = (long)&local_1a0 + 0x18;
                    local_300._24_8_ = &local_1a0;
                    _Stack_2e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    peStack_2d8 = (element_type *)0x3;
                    _Stack_2d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x6;
                    local_4d8 = pCVar53;
                    local_4c1._1_8_ = dVar52;
                    local_2c0._M_pi = p_Var51;
                    ChMatrix33<double>::operator=
                              ((ChMatrix33<double> *)(local_410 + 0x18),
                               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                                *)local_300);
                    if (((long)local_500.m_src < (long)local_440) ||
                       ((long)local_500.m_functor < lVar41)) goto LAB_0069e8dc;
                    lVar41 = (long)local_498 * (long)local_500.m_functor;
                    puVar46 = (undefined1 *)
                              ((long)(((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                                      &(local_500.m_dst)->
                                       super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                                      )->m_storage).m_data.array + lVar49);
                    lVar50 = 0x10;
                    do {
                      dVar52 = *(double *)(local_410 + lVar50 + 0x10);
                      dVar4 = *(double *)((long)(puVar46 + lVar41 + -0x10) + 8);
                      *(double *)(puVar46 + lVar41 + -0x10) =
                           *(double *)(local_410 + lVar50 + 8) +
                           *(double *)(puVar46 + lVar41 + -0x10);
                      *(double *)((long)(puVar46 + lVar41 + -0x10) + 8) = dVar52 + dVar4;
                      *(double *)(puVar46 + lVar41) =
                           *(double *)(local_410 + lVar50 + 0x18) + *(double *)(puVar46 + lVar41);
                      lVar50 = lVar50 + 0x18;
                      puVar46 = puVar46 + (long)local_500.m_functor * 8;
                    } while (lVar50 != 0x58);
                    if (((long)local_500.m_src < (long)local_460) ||
                       ((long)local_500.m_functor < (long)local_4c1._1_8_)) goto LAB_0069e8dc;
                    peVar2 = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                              *)(&((element_type *)((long)local_500.m_dst + uVar47 * 3 * 0x10))->
                                  _vptr_ChElasticityCosserat +
                                (long)local_500.m_functor * (long)local_440);
                    if (((element_type *)local_500.m_dst != (element_type *)0x0) &&
                       ((evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *
                        )(local_410 + 0x18) == peVar2)) goto LAB_0069e920;
                    (peVar2->m_d).data =
                         (double *)
                         ((double)local_3f8.super_ChBeamSection._vptr_ChBeamSection +
                         (peVar2->m_d).data);
                    peVar2[1].m_d.data =
                         (double *)
                         ((double)local_3f8.elasticity.
                                  super___shared_ptr<chrono::fea::ChElasticityCosserat,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr + (double)peVar2[1].m_d.data);
                    peVar2[2].m_d.data =
                         (double *)
                         ((double)local_3f8.plasticity.
                                  super___shared_ptr<chrono::fea::ChPlasticityCosserat,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi + (double)peVar2[2].m_d.data);
                    peVar2[(long)local_500.m_functor] =
                         (plainobjectbase_evaluator_data<double,_3>)
                         ((double)local_3f8.super_ChBeamSection.draw_shape.
                                  super___shared_ptr<chrono::fea::ChBeamSectionShape,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr + (double)*(double **)(peVar2 + (long)local_500.m_functor)
                         );
                    peVar2[(long)&((ChBeamSection *)&(local_500.m_functor)->field_0x0)->
                                  _vptr_ChBeamSection + 1] =
                         (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>)
                         ((double)local_3f8.elasticity.
                                  super___shared_ptr<chrono::fea::ChElasticityCosserat,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi +
                         *(double *)
                          (peVar2 + (long)&((ChBeamSection *)&(local_500.m_functor)->field_0x0)->
                                           _vptr_ChBeamSection + 1));
                    peVar2[(long)&((ChBeamSection *)&(local_500.m_functor)->field_0x0)->
                                  _vptr_ChBeamSection + 2] =
                         (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>)
                         ((double)local_3f8.damping.
                                  super___shared_ptr<chrono::fea::ChDampingCosserat,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr +
                         *(double *)
                          (peVar2 + (long)&((ChBeamSection *)&(local_500.m_functor)->field_0x0)->
                                           _vptr_ChBeamSection + 2));
                    peVar2[(long)local_500.m_functor * 2] =
                         (plainobjectbase_evaluator_data<double,_3>)
                         ((double)local_3f8.super_ChBeamSection.draw_shape.
                                  super___shared_ptr<chrono::fea::ChBeamSectionShape,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi +
                         (double)*(double **)(peVar2 + (long)local_500.m_functor * 2));
                    peVar2[(long)local_500.m_functor * 2U + 1] =
                         (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>)
                         ((double)local_3f8.plasticity.
                                  super___shared_ptr<chrono::fea::ChPlasticityCosserat,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr + *(double *)(peVar2 + (long)local_500.m_functor * 2U + 1)
                         );
                    peVar2[(long)local_500.m_functor * 2U + 2] =
                         (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>)
                         ((double)local_3f8.damping.
                                  super___shared_ptr<chrono::fea::ChDampingCosserat,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi +
                         *(double *)(peVar2 + (long)local_500.m_functor * 2U + 2));
                    uVar47 = uVar47 + 1;
                    pCVar53 = (ChBeamSectionCosserat *)
                              &(local_4d8->plasticity).
                               super___shared_ptr<chrono::fea::ChPlasticityCosserat,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount;
                    lVar49 = lVar49 + 0x30;
                    p_Var51 = local_498;
                    this_00 = local_4e0;
                  } while (uVar47 < (ulong)((long)(local_4e0->nodes).
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)(local_4e0->nodes).
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 4));
                }
                uVar43 = uVar43 + 1;
                p_Var51 = p_Var51 + 3;
                local_3a0 = (double)((long)local_3a0 + 0x30);
              } while (uVar43 < (ulong)((long)(this_00->nodes).
                                              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(this_00->nodes).
                                              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start >> 4));
            }
            if ((ChBeamSectionCosserat *)local_360._0_8_ != (ChBeamSectionCosserat *)0x0) {
              free((((ChBeamSectionCosserat *)(local_360._0_8_ + -0x58))->inertia).
                   super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
            }
            dVar52 = (double)((long)local_1b0[0] + 1);
            peVar48 = local_4d0;
          } while ((long)dVar52 < (long)this_00->int_order_b);
        }
      }
      local_1a0.super_ChBeamSection._vptr_ChBeamSection =
           (_func_int **)
           (((RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
              *)&peVar48->_vptr_ChElasticityCosserat)->
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
           ).
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           .m_data;
      pCVar53 = peVar48[1].section;
      local_1a0.super_ChBeamSection.draw_shape.
      super___shared_ptr<chrono::fea::ChBeamSectionShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_500.m_src;
      local_1a0.super_ChBeamSection.draw_shape.
      super___shared_ptr<chrono::fea::ChBeamSectionShape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_500.m_functor;
      if ((long)((ulong)local_500.m_functor | (ulong)local_500.m_src) < 0 &&
          (ChBeamSectionCosserat *)local_1a0.super_ChBeamSection._vptr_ChBeamSection !=
          (ChBeamSectionCosserat *)0x0) {
        pcVar42 = 
        "Eigen::MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>>, Level = 0]"
        ;
LAB_0069e9e2:
        __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                      ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,pcVar42);
      }
      local_1a0.elasticity.
      super___shared_ptr<chrono::fea::ChElasticityCosserat,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_1a0.plasticity.
      super___shared_ptr<chrono::fea::ChPlasticityCosserat,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_1a0.elasticity.
      super___shared_ptr<chrono::fea::ChElasticityCosserat,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           peVar48;
      local_1a0.plasticity.
      super___shared_ptr<chrono::fea::ChPlasticityCosserat,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pCVar53;
      if (((((long)local_500.m_src < 0) || ((long)local_500.m_functor < 0)) ||
          (((variable_if_dynamic<long,__1> *)&peVar48->section)->m_value < (long)local_500.m_src))
         || ((long)peVar48[1]._vptr_ChElasticityCosserat < (long)local_500.m_functor)) {
LAB_0069ea33:
        local_1a0.plasticity.
        super___shared_ptr<chrono::fea::ChPlasticityCosserat,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_1a0.elasticity.
        super___shared_ptr<chrono::fea::ChElasticityCosserat,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                      "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
                     );
      }
      local_300._8_8_ = &local_490;
      local_490.m_data = (double *)local_500.m_dst;
      local_490.m_rows = (Index)local_500.m_functor;
      local_300._0_8_ = local_360;
      local_300._16_8_ = local_410;
      local_300._24_8_ = &local_1a0;
      local_360._0_8_ = local_1a0.super_ChBeamSection._vptr_ChBeamSection;
      local_360._16_8_ = pCVar53;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_Eigen::internal::add_assign_op<double,_double>,_0>,_4,_0>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
             *)local_300);
      if ((element_type *)local_500.m_dst != (element_type *)0x0) {
        free(((element_type *)((long)local_500.m_dst + 0xfffffffffffffff0))->section);
      }
      goto LAB_0069e850;
    }
  }
  pcVar42 = 
  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1, 1>]"
  ;
LAB_0069e9a1:
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,pcVar42);
LAB_0069e956:
  pcVar42 = 
  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
  ;
  goto LAB_0069e9a1;
LAB_0069e98c:
  pcVar42 = 
  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
  ;
  goto LAB_0069e9a1;
LAB_0069e9ae:
  pcVar42 = 
  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>>, T1 = double, T2 = double]"
  ;
  goto LAB_0069e9c3;
LAB_0069e9cd:
  pcVar42 = 
  "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>, Level = 0]"
  ;
  goto LAB_0069e9e2;
LAB_0069ea11:
  pcVar42 = 
  "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>]"
  ;
LAB_0069ea26:
  __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,pcVar42);
}

Assistant:

void ChElementBeamIGA::ComputeKRMmatricesGlobal(ChMatrixRef H, double Kfactor, double Rfactor, double Mfactor) {
    assert((H.rows() == 6 * nodes.size()) && (H.cols() == 6 * nodes.size()));
    assert(section);

    // BRUTE FORCE METHOD: USE NUMERICAL DIFFERENTIATION!

    //
    // The K stiffness matrix of this element span:
    //

    ChState state_x(this->LoadableGet_ndof_x(), nullptr);
    ChStateDelta state_w(this->LoadableGet_ndof_w(), nullptr);
    this->LoadableGetStateBlock_x(0, state_x);
    this->LoadableGetStateBlock_w(0, state_w);

    int mrows_w = this->LoadableGet_ndof_w();
    int mrows_x = this->LoadableGet_ndof_x();

    // compute Q at current speed & position, x_0, v_0
    ChVectorDynamic<> Q0(mrows_w);
    this->ComputeInternalForces_impl(Q0, state_x, state_w, true);  // Q0 = Q(x, v)

    ChVectorDynamic<> Q1(mrows_w);
    ChVectorDynamic<> Jcolumn(mrows_w);

    if (Kfactor) {
        ChMatrixDynamic<> K(mrows_w, mrows_w);

        ChState state_x_inc(mrows_x, nullptr);
        ChStateDelta state_delta(mrows_w, nullptr);

        // Compute K=-dQ(x,v)/dx by backward differentiation
        state_delta.setZero(mrows_w, nullptr);

        for (int i = 0; i < mrows_w; ++i) {
            state_delta(i) += Delta;
            this->LoadableStateIncrement(0, state_x_inc, state_x, 0,
                                         state_delta);  // exponential, usually state_x_inc(i) = state_x(i) + Delta;

            Q1.setZero(mrows_w);
            this->ComputeInternalForces_impl(Q1, state_x_inc, state_w, true);  // Q1 = Q(x+Dx, v)
            state_delta(i) -= Delta;

            Jcolumn = (Q1 - Q0) * (-1.0 / Delta);  // - sign because K=-dQ/dx
            K.col(i) = Jcolumn;
        }

        // finally, store K into H:
        H.block(0, 0, mrows_w, mrows_w) = Kfactor * K;
    } else
        H.setZero();

    //
    // The R damping matrix of this element:
    //

    if (Rfactor && this->section->GetDamping()) {
        // Compute R=-dQ(x,v)/dv by backward differentiation
        ChStateDelta state_w_inc(mrows_w, nullptr);
        state_w_inc = state_w;
        ChMatrixDynamic<> R(mrows_w, mrows_w);

        for (int i = 0; i < mrows_w; ++i) {
            Q1.setZero(mrows_w);

            state_w_inc(i) += Delta;
            this->ComputeInternalForces_impl(Q1, state_x, state_w_inc, true);  // Q1 = Q(x, v+Dv)
            state_w_inc(i) -= Delta;

            Jcolumn = (Q1 - Q0) * (-1.0 / Delta);  // - sign because R=-dQ/dv
            R.col(i) = Jcolumn;
        }
        H.block(0, 0, mrows_w, mrows_w) += Rfactor * R;
    }

    // Add inertial stiffness matrix and inertial damping matrix (gyroscopic damping),
    // if enabled in section material.
    // These matrices are not symmetric.
    // A lumped version of the inertial damping/stiffness matrix computation is used here,
    // on a per-node basis. In future one could implement also a consistent version of it, optionally, depending on
    // ChElementBeamIGA::lumped_mass.
    if ((Rfactor && this->section->GetInertia()->compute_inertia_damping_matrix) ||
        (Kfactor && this->section->GetInertia()->compute_inertia_stiffness_matrix)) {
        ChMatrixNM<double, 6, 6> matr_loc;
        ChMatrixNM<double, 6, 6> KRi_loc;
        KRi_loc.setZero();

        double node_multiplier_fact_R = 0.5 * length * Rfactor;
        double node_multiplier_fact_K = 0.5 * length * Kfactor;
        for (int i = 0; i < nodes.size(); ++i) {
            int stride = i * 6;
            if (this->section->GetInertia()->compute_inertia_damping_matrix) {
                this->section->GetInertia()->ComputeInertiaDampingMatrix(matr_loc, nodes[i]->GetWvel_loc());
                KRi_loc += matr_loc * node_multiplier_fact_R;
            }
            if (this->section->GetInertia()->compute_inertia_stiffness_matrix) {
                this->section->GetInertia()->ComputeInertiaStiffnessMatrix(
                    matr_loc, nodes[i]->GetWvel_loc(), nodes[i]->GetWacc_loc(),
                    (nodes[i]->GetA().transpose()) * nodes[i]->GetPos_dtdt());  // assume x_dtdt in local frame!
                KRi_loc += matr_loc * node_multiplier_fact_K;
            }
            // corotate the local damping and stiffness matrices (at once, already scaled) into absolute one
            // H.block<3, 3>(stride,   stride  ) += nodes[i]->GetA() * KRi_loc.block<3, 3>(0,0) *
            // (nodes[i]->GetA().transpose()); // NOTE: not needed as KRi_loc.block<3, 3>(0,0) is null by construction
            H.block<3, 3>(stride + 3, stride + 3) += KRi_loc.block<3, 3>(3, 3);
            H.block<3, 3>(stride, stride + 3) += nodes[i]->GetA() * KRi_loc.block<3, 3>(0, 3);
            // H.block<3, 3>(stride+3, stride)   +=                    KRi_loc.block<3, 3>(3,0) *
            // (nodes[i]->GetA().transpose());  // NOTE: not needed as KRi_loc.block<3, 3>(3,0) is null by construction
        }
    }

    //
    // The M mass matrix of this element span:
    //

    if (Mfactor) {
        ChMatrixDynamic<> Mloc(6 * nodes.size(), 6 * nodes.size());
        Mloc.setZero();
        ChMatrix33<> Mxw;

        if (ChElementBeamIGA::lumped_mass == true) {
            //
            // "lumped" M mass matrix
            //
            ChMatrixNM<double, 6, 6> sectional_mass;
            this->section->GetInertia()->ComputeInertiaMatrix(sectional_mass);

            double node_multiplier = length / (double)nodes.size();
            for (int i = 0; i < nodes.size(); ++i) {
                int stride = i * 6;
                // if there is no mass center offset, the upper right and lower left blocks need not be rotated,
                // hence it can be the simple (constant) expression
                //   Mloc.block<6, 6>(stride, stride) += sectional_mass * (node_multiplier * Mfactor);
                // but the more general case needs the rotations, hence:
                Mloc.block<3, 3>(stride, stride) += sectional_mass.block<3, 3>(0, 0) * (node_multiplier * Mfactor);
                Mloc.block<3, 3>(stride + 3, stride + 3) +=
                    sectional_mass.block<3, 3>(3, 3) * (node_multiplier * Mfactor);
                Mxw = nodes[i]->GetA() * sectional_mass.block<3, 3>(0, 3) * (node_multiplier * Mfactor);
                Mloc.block<3, 3>(stride, stride + 3) += Mxw;
                Mloc.block<3, 3>(stride + 3, stride) += Mxw.transpose();
            }
        } else {
            //
            // "consistent" M mass matrix, via Gauss quadrature
            //
            ChMatrixNM<double, 6, 6> sectional_mass;
            this->section->GetInertia()->ComputeInertiaMatrix(sectional_mass);

            double u1 = knots(order);
            double u2 = knots(knots.size() - order - 1);

            double c1 = (u2 - u1) / 2;
            double c2 = (u2 + u1) / 2;

            // Do quadrature over the Gauss points - reuse the "b" bend Gauss points

            for (int ig = 0; ig < int_order_b; ++ig) {
                // absyssa in typical -1,+1 range:
                double eta = ChQuadrature::GetStaticTables()->Lroots[int_order_b - 1][ig];
                // absyssa in span range:
                double u = (c1 * eta + c2);
                // scaling = gauss weight
                double w = ChQuadrature::GetStaticTables()->Weight[int_order_b - 1][ig];

                // Jacobian Jsu = ds/du
                double Jsu = this->Jacobian_b[ig];
                // Jacobian Jue = du/deta
                double Jue = c1;

                // compute the basis functions N(u) at given u:
                int nspan = order;

                ChVectorDynamic<> N((int)nodes.size());
                geometry::ChBasisToolsBspline::BasisEvaluate(this->order, nspan, u, knots, N);

                /*
                // interpolate rotation of section at given u, to compute R.
                ChQuaternion<> q_delta;
                ChVector<> da = VNULL;
                ChVector<> delta_rot_dir;
                double delta_rot_angle;
                for (int i = 0; i < nodes.size(); ++i) {
                    ChQuaternion<> q_i(state_x.segment(i * 7 + 3, 4));
                    q_delta = nodes[0]->coord.rot.GetConjugate() * q_i;
                    q_delta.Q_to_AngAxis(delta_rot_angle, delta_rot_dir); // a_i = dir_i*angle_i (in spline local
                reference, -PI..+PI) da += delta_rot_dir * delta_rot_angle * N(i);  // a = N_i*a_i
                }
                ChQuaternion<> qda; qda.Q_from_Rotv(da);
                ChQuaternion<> qR = nodes[0]->coord.rot * qda;

                // compute the 3x3 rotation matrix R equivalent to quaternion above
                ChMatrix33<> R(qR);
                */

                // A simplification, for moderate bending, ignore the difference between beam section R
                // and R_i of nearby nodes, obtaining:

                for (int i = 0; i < nodes.size(); ++i) {
                    for (int j = 0; j < nodes.size(); ++j) {
                        int istride = i * 6;
                        int jstride = j * 6;

                        double Ni_Nj = N(i) * N(j);
                        double gmassfactor = Mfactor * w * Jsu * Jue * Ni_Nj;

                        // if there is no mass center offset, the upper right and lower left blocks need not be rotated,
                        // hence it can be the simple (constant) expression
                        //   Mloc.block<6, 6>(istride + 0, jstride + 0) += gmassfactor * sectional_mass;
                        // but the more general case needs the rotations, hence:
                        Mloc.block<3, 3>(istride, jstride) += sectional_mass.block<3, 3>(0, 0) * gmassfactor;
                        Mloc.block<3, 3>(istride + 3, jstride + 3) += sectional_mass.block<3, 3>(3, 3) * gmassfactor;
                        Mxw = nodes[i]->GetA() * sectional_mass.block<3, 3>(0, 3) * gmassfactor;
                        Mloc.block<3, 3>(istride, jstride + 3) += Mxw;
                        Mloc.block<3, 3>(istride + 3, jstride) += Mxw.transpose();
                    }
                }

            }  // end loop on gauss points
        }

        H.block(0, 0, Mloc.rows(), Mloc.cols()) += Mloc;
    }
}